

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O3

void FeatureParameterExtraction(NoiseSuppressionC *self,int flag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  if (flag == 0) {
    fVar19 = self->featureData[3];
    if ((0.0 <= fVar19) &&
       (fVar15 = (self->featureExtractionParams).binSizeLrt, fVar19 < fVar15 * 1000.0)) {
      self->histLrt[(int)(fVar19 / fVar15)] = self->histLrt[(int)(fVar19 / fVar15)] + 1;
    }
    fVar19 = self->featureData[0];
    if ((0.0 <= fVar19) &&
       (fVar15 = (self->featureExtractionParams).binSizeSpecFlat, fVar19 < fVar15 * 1000.0)) {
      self->histSpecFlat[(int)(fVar19 / fVar15)] = self->histSpecFlat[(int)(fVar19 / fVar15)] + 1;
    }
    fVar19 = self->featureData[4];
    if ((0.0 <= fVar19) &&
       (fVar15 = (self->featureExtractionParams).binSizeSpecDiff, fVar19 < fVar15 * 1000.0)) {
      self->histSpecDiff[(int)(fVar19 / fVar15)] = self->histSpecDiff[(int)(fVar19 / fVar15)] + 1;
      return;
    }
  }
  else if (flag == 1) {
    fVar15 = 0.0;
    fVar16 = 0.0;
    fVar19 = 0.0;
    lVar11 = 0;
    iVar6 = 0;
    do {
      fVar20 = ((float)(int)lVar11 + 0.5) * (self->featureExtractionParams).binSizeLrt;
      iVar8 = self->histLrt[lVar11];
      fVar22 = (float)iVar8;
      fVar24 = fVar22 * fVar20;
      if ((self->featureExtractionParams).rangeAvgHistLrt < fVar20) {
        iVar8 = 0;
      }
      else {
        fVar19 = fVar19 + fVar24;
      }
      iVar6 = iVar6 + iVar8;
      fVar15 = fVar15 + fVar20 * fVar22;
      fVar16 = fVar16 + fVar20 * fVar24;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 1000);
    if (0 < iVar6) {
      fVar19 = fVar19 / (float)iVar6;
    }
    fVar20 = fVar16 / (float)self->modelUpdatePars[1] -
             (fVar15 / (float)self->modelUpdatePars[1]) * fVar19;
    fVar15 = (self->featureExtractionParams).thresFluctLrt;
    if (fVar20 < fVar15) {
      self->priorModelPars[0] = (self->featureExtractionParams).maxLrt;
    }
    else {
      fVar19 = fVar19 * (self->featureExtractionParams).factor1ModelPars;
      self->priorModelPars[0] = fVar19;
      fVar22 = (self->featureExtractionParams).minLrt;
      if (fVar19 < fVar22) {
        self->priorModelPars[0] = fVar22;
        fVar19 = fVar22;
      }
      fVar22 = (self->featureExtractionParams).maxLrt;
      if (fVar22 < fVar19) {
        self->priorModelPars[0] = fVar22;
      }
    }
    lVar11 = 0;
    iVar7 = 0;
    iVar12 = 0;
    fVar19 = 0.0;
    fVar22 = 0.0;
    iVar6 = 0;
    iVar8 = 0;
    do {
      fVar25 = ((float)(int)lVar11 + 0.5) * (self->featureExtractionParams).binSizeSpecFlat;
      iVar14 = self->histSpecFlat[lVar11];
      fVar24 = fVar25;
      fVar21 = fVar19;
      iVar1 = iVar14;
      iVar13 = iVar12;
      iVar2 = iVar14;
      iVar10 = iVar7;
      if ((iVar14 <= iVar12) &&
         (fVar24 = fVar19, fVar21 = fVar22, iVar1 = iVar7, iVar13 = iVar6, iVar2 = iVar12,
         iVar10 = iVar8, iVar6 < iVar14)) {
        fVar21 = fVar25;
        iVar13 = iVar14;
        iVar10 = iVar14;
      }
      iVar12 = iVar2;
      iVar7 = iVar1;
      lVar11 = lVar11 + 1;
      fVar19 = fVar24;
      fVar22 = fVar21;
      iVar6 = iVar13;
      iVar8 = iVar10;
    } while (lVar11 != 1000);
    lVar11 = 0;
    iVar12 = 0;
    iVar6 = 0;
    iVar8 = 0;
    iVar14 = 0;
    fVar19 = 0.0;
    fVar22 = 0.0;
    do {
      fVar26 = ((float)(int)lVar11 + 0.5) * (self->featureExtractionParams).binSizeSpecDiff;
      iVar1 = self->histSpecDiff[lVar11];
      fVar25 = fVar26;
      fVar23 = fVar19;
      iVar13 = iVar6;
      iVar2 = iVar14;
      iVar3 = iVar1;
      iVar4 = iVar1;
      if ((iVar1 <= iVar14) &&
         (fVar25 = fVar19, fVar23 = fVar22, iVar13 = iVar12, iVar2 = iVar8, iVar3 = iVar6,
         iVar4 = iVar14, iVar8 < iVar1)) {
        fVar23 = fVar26;
        iVar13 = iVar1;
        iVar2 = iVar1;
      }
      iVar14 = iVar4;
      iVar6 = iVar3;
      iVar8 = iVar2;
      iVar12 = iVar13;
      lVar11 = lVar11 + 1;
      fVar19 = fVar25;
      fVar22 = fVar23;
    } while (lVar11 != 1000);
    if ((ABS(fVar21 - fVar24) < (self->featureExtractionParams).limitPeakSpacingSpecFlat) &&
       ((float)iVar7 * (self->featureExtractionParams).limitPeakWeightsSpecFlat < (float)iVar10)) {
      iVar7 = iVar7 + iVar10;
      fVar24 = (fVar24 + fVar21) * 0.5;
    }
    bVar9 = 0;
    if (((self->featureExtractionParams).thresWeightSpecFlat <= iVar7) &&
       (bVar9 = 0, (self->featureExtractionParams).thresPosSpecFlat <= fVar24)) {
      fVar24 = fVar24 * (self->featureExtractionParams).factor2ModelPars;
      self->priorModelPars[1] = fVar24;
      fVar19 = (self->featureExtractionParams).minSpecFlat;
      if (fVar24 < fVar19) {
        self->priorModelPars[1] = fVar19;
        fVar24 = fVar19;
      }
      fVar19 = (self->featureExtractionParams).maxSpecFlat;
      bVar9 = 1;
      if (fVar19 < fVar24) {
        self->priorModelPars[1] = fVar19;
      }
    }
    if ((ABS(fVar23 - fVar25) < (self->featureExtractionParams).limitPeakSpacingSpecDiff) &&
       ((float)iVar6 * (self->featureExtractionParams).limitPeakWeightsSpecDiff < (float)iVar12)) {
      iVar6 = iVar6 + iVar12;
      fVar25 = (fVar25 + fVar23) * 0.5;
    }
    fVar25 = fVar25 * (self->featureExtractionParams).factor1ModelPars;
    self->priorModelPars[3] = fVar25;
    fVar19 = (self->featureExtractionParams).minSpecDiff;
    if (fVar25 < fVar19) {
      self->priorModelPars[3] = fVar19;
      fVar25 = fVar19;
    }
    iVar8 = (self->featureExtractionParams).thresWeightSpecDiff;
    fVar19 = (self->featureExtractionParams).maxSpecDiff;
    if (fVar19 < fVar25) {
      self->priorModelPars[3] = fVar19;
    }
    bVar5 = fVar15 <= fVar20 && iVar8 <= iVar6;
    fVar19 = (float)(byte)(bVar9 + bVar5 + 1);
    auVar17._4_4_ = (float)bVar9;
    auVar17._0_4_ = 0x3f800000;
    auVar17._8_8_ = 0;
    auVar18._4_4_ = fVar19;
    auVar18._0_4_ = fVar19;
    auVar18._8_4_ = fVar16;
    auVar18._12_4_ = fVar16;
    auVar18 = divps(auVar17,auVar18);
    *(long *)(self->priorModelPars + 4) = auVar18._0_8_;
    self->priorModelPars[6] = (float)bVar5 / fVar19;
    if (0 < self->modelUpdatePars[0]) {
      memset(self->histLrt,0,12000);
      return;
    }
  }
  return;
}

Assistant:

static void FeatureParameterExtraction(NoiseSuppressionC* self, int flag) {
  int i, useFeatureSpecFlat, useFeatureSpecDiff, numHistLrt;
  int maxPeak1, maxPeak2;
  int weightPeak1SpecFlat, weightPeak2SpecFlat, weightPeak1SpecDiff,
      weightPeak2SpecDiff;

  float binMid, featureSum;
  float posPeak1SpecFlat, posPeak2SpecFlat, posPeak1SpecDiff, posPeak2SpecDiff;
  float fluctLrt, avgHistLrt, avgSquareHistLrt, avgHistLrtCompl;

  // 3 features: LRT, flatness, difference.
  // lrt_feature = self->featureData[3];
  // flat_feature = self->featureData[0];
  // diff_feature = self->featureData[4];

  // Update histograms.
  if (flag == 0) {
    // LRT
    if ((self->featureData[3] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeLrt) &&
        (self->featureData[3] >= 0.0)) {
      i = (int)(self->featureData[3] /
                self->featureExtractionParams.binSizeLrt);
      self->histLrt[i]++;
    }
    // Spectral flatness.
    if ((self->featureData[0] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeSpecFlat) &&
        (self->featureData[0] >= 0.0)) {
      i = (int)(self->featureData[0] /
                self->featureExtractionParams.binSizeSpecFlat);
      self->histSpecFlat[i]++;
    }
    // Spectral difference.
    if ((self->featureData[4] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeSpecDiff) &&
        (self->featureData[4] >= 0.0)) {
      i = (int)(self->featureData[4] /
                self->featureExtractionParams.binSizeSpecDiff);
      self->histSpecDiff[i]++;
    }
  }

  // Extract parameters for speech/noise probability.
  if (flag == 1) {
    // LRT feature: compute the average over
    // self->featureExtractionParams.rangeAvgHistLrt.
    avgHistLrt = 0.0;
    avgHistLrtCompl = 0.0;
    avgSquareHistLrt = 0.0;
    numHistLrt = 0;
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid = ((float)i + 0.5f) * self->featureExtractionParams.binSizeLrt;
      if (binMid <= self->featureExtractionParams.rangeAvgHistLrt) {
        avgHistLrt += self->histLrt[i] * binMid;
        numHistLrt += self->histLrt[i];
      }
      avgSquareHistLrt += self->histLrt[i] * binMid * binMid;
      avgHistLrtCompl += self->histLrt[i] * binMid;
    }
    if (numHistLrt > 0) {
      avgHistLrt = avgHistLrt / ((float)numHistLrt);
    }
    avgHistLrtCompl = avgHistLrtCompl / ((float)self->modelUpdatePars[1]);
    avgSquareHistLrt = avgSquareHistLrt / ((float)self->modelUpdatePars[1]);
    fluctLrt = avgSquareHistLrt - avgHistLrt * avgHistLrtCompl;
    // Get threshold for LRT feature.
    if (fluctLrt < self->featureExtractionParams.thresFluctLrt) {
      // Very low fluctuation, so likely noise.
      self->priorModelPars[0] = self->featureExtractionParams.maxLrt;
    } else {
      self->priorModelPars[0] =
          self->featureExtractionParams.factor1ModelPars * avgHistLrt;
      // Check if value is within min/max range.
      if (self->priorModelPars[0] < self->featureExtractionParams.minLrt) {
        self->priorModelPars[0] = self->featureExtractionParams.minLrt;
      }
      if (self->priorModelPars[0] > self->featureExtractionParams.maxLrt) {
        self->priorModelPars[0] = self->featureExtractionParams.maxLrt;
      }
    }
    // Done with LRT feature.

    // For spectral flatness and spectral difference: compute the main peaks of
    // histogram.
    maxPeak1 = 0;
    maxPeak2 = 0;
    posPeak1SpecFlat = 0.0;
    posPeak2SpecFlat = 0.0;
    weightPeak1SpecFlat = 0;
    weightPeak2SpecFlat = 0;

    // Peaks for flatness.
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid =
          (i + 0.5f) * self->featureExtractionParams.binSizeSpecFlat;
      if (self->histSpecFlat[i] > maxPeak1) {
        // Found new "first" peak.
        maxPeak2 = maxPeak1;
        weightPeak2SpecFlat = weightPeak1SpecFlat;
        posPeak2SpecFlat = posPeak1SpecFlat;

        maxPeak1 = self->histSpecFlat[i];
        weightPeak1SpecFlat = self->histSpecFlat[i];
        posPeak1SpecFlat = binMid;
      } else if (self->histSpecFlat[i] > maxPeak2) {
        // Found new "second" peak.
        maxPeak2 = self->histSpecFlat[i];
        weightPeak2SpecFlat = self->histSpecFlat[i];
        posPeak2SpecFlat = binMid;
      }
    }

    // Compute two peaks for spectral difference.
    maxPeak1 = 0;
    maxPeak2 = 0;
    posPeak1SpecDiff = 0.0;
    posPeak2SpecDiff = 0.0;
    weightPeak1SpecDiff = 0;
    weightPeak2SpecDiff = 0;
    // Peaks for spectral difference.
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid =
          ((float)i + 0.5f) * self->featureExtractionParams.binSizeSpecDiff;
      if (self->histSpecDiff[i] > maxPeak1) {
        // Found new "first" peak.
        maxPeak2 = maxPeak1;
        weightPeak2SpecDiff = weightPeak1SpecDiff;
        posPeak2SpecDiff = posPeak1SpecDiff;

        maxPeak1 = self->histSpecDiff[i];
        weightPeak1SpecDiff = self->histSpecDiff[i];
        posPeak1SpecDiff = binMid;
      } else if (self->histSpecDiff[i] > maxPeak2) {
        // Found new "second" peak.
        maxPeak2 = self->histSpecDiff[i];
        weightPeak2SpecDiff = self->histSpecDiff[i];
        posPeak2SpecDiff = binMid;
      }
    }

    // For spectrum flatness feature.
    useFeatureSpecFlat = 1;
    // Merge the two peaks if they are close.
    if ((fabs(posPeak2SpecFlat - posPeak1SpecFlat) <
         self->featureExtractionParams.limitPeakSpacingSpecFlat) &&
        (weightPeak2SpecFlat >
         self->featureExtractionParams.limitPeakWeightsSpecFlat *
             weightPeak1SpecFlat)) {
      weightPeak1SpecFlat += weightPeak2SpecFlat;
      posPeak1SpecFlat = 0.5f * (posPeak1SpecFlat + posPeak2SpecFlat);
    }
    // Reject if weight of peaks is not large enough, or peak value too small.
    if (weightPeak1SpecFlat <
            self->featureExtractionParams.thresWeightSpecFlat ||
        posPeak1SpecFlat < self->featureExtractionParams.thresPosSpecFlat) {
      useFeatureSpecFlat = 0;
    }
    // If selected, get the threshold.
    if (useFeatureSpecFlat == 1) {
      // Compute the threshold.
      self->priorModelPars[1] =
          self->featureExtractionParams.factor2ModelPars * posPeak1SpecFlat;
      // Check if value is within min/max range.
      if (self->priorModelPars[1] < self->featureExtractionParams.minSpecFlat) {
        self->priorModelPars[1] = self->featureExtractionParams.minSpecFlat;
      }
      if (self->priorModelPars[1] > self->featureExtractionParams.maxSpecFlat) {
        self->priorModelPars[1] = self->featureExtractionParams.maxSpecFlat;
      }
    }
    // Done with flatness feature.

    // For template feature.
    useFeatureSpecDiff = 1;
    // Merge the two peaks if they are close.
    if ((fabs(posPeak2SpecDiff - posPeak1SpecDiff) <
         self->featureExtractionParams.limitPeakSpacingSpecDiff) &&
        (weightPeak2SpecDiff >
         self->featureExtractionParams.limitPeakWeightsSpecDiff *
             weightPeak1SpecDiff)) {
      weightPeak1SpecDiff += weightPeak2SpecDiff;
      posPeak1SpecDiff = 0.5f * (posPeak1SpecDiff + posPeak2SpecDiff);
    }
    // Get the threshold value.
    self->priorModelPars[3] =
        self->featureExtractionParams.factor1ModelPars * posPeak1SpecDiff;
    // Reject if weight of peaks is not large enough.
    if (weightPeak1SpecDiff <
        self->featureExtractionParams.thresWeightSpecDiff) {
      useFeatureSpecDiff = 0;
    }
    // Check if value is within min/max range.
    if (self->priorModelPars[3] < self->featureExtractionParams.minSpecDiff) {
      self->priorModelPars[3] = self->featureExtractionParams.minSpecDiff;
    }
    if (self->priorModelPars[3] > self->featureExtractionParams.maxSpecDiff) {
      self->priorModelPars[3] = self->featureExtractionParams.maxSpecDiff;
    }
    // Done with spectral difference feature.

    // Don't use template feature if fluctuation of LRT feature is very low:
    // most likely just noise state.
    if (fluctLrt < self->featureExtractionParams.thresFluctLrt) {
      useFeatureSpecDiff = 0;
    }

    // Select the weights between the features.
    // self->priorModelPars[4] is weight for LRT: always selected.
    // self->priorModelPars[5] is weight for spectral flatness.
    // self->priorModelPars[6] is weight for spectral difference.
    featureSum = (float)(1 + useFeatureSpecFlat + useFeatureSpecDiff);
    self->priorModelPars[4] = 1.f / featureSum;
    self->priorModelPars[5] = ((float)useFeatureSpecFlat) / featureSum;
    self->priorModelPars[6] = ((float)useFeatureSpecDiff) / featureSum;

    // Set hists to zero for next update.
    if (self->modelUpdatePars[0] >= 1) {
      for (i = 0; i < HIST_PAR_EST; i++) {
        self->histLrt[i] = 0;
        self->histSpecFlat[i] = 0;
        self->histSpecDiff[i] = 0;
      }
    }
  }  // End of flag == 1.
}